

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase56::run(TestCase56 *this)

{
  Nested *pNVar1;
  Own<kj::(anonymous_namespace)::Nested> *other;
  bool local_48;
  bool local_47;
  bool local_46;
  bool local_45;
  bool _kj_shouldLog_3;
  bool _kj_shouldLog_2;
  bool _kj_shouldLog_1;
  bool _kj_shouldLog;
  Own<kj::(anonymous_namespace)::Nested> local_38;
  undefined1 local_28 [8];
  Own<kj::(anonymous_namespace)::Nested> nested;
  bool destroyed2;
  bool destroyed1;
  TestCase56 *this_local;
  
  nested.ptr._7_1_ = 0;
  nested.ptr._6_1_ = 0;
  heap<kj::(anonymous_namespace)::Nested,bool&>((kj *)local_28,(bool *)((long)&nested.ptr + 7));
  heap<kj::(anonymous_namespace)::Nested,bool&>((kj *)&local_38,(bool *)((long)&nested.ptr + 6));
  pNVar1 = Own<kj::(anonymous_namespace)::Nested>::operator->
                     ((Own<kj::(anonymous_namespace)::Nested> *)local_28);
  Own<kj::(anonymous_namespace)::Nested>::operator=(&pNVar1->nested,&local_38);
  Own<kj::(anonymous_namespace)::Nested>::~Own(&local_38);
  if (((nested.ptr._7_1_ & 1) != 0) || ((nested.ptr._6_1_ & 1) != 0)) {
    local_45 = _::Debug::shouldLog(ERROR);
    while (local_45 != false) {
      _::Debug::log<char_const(&)[45]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/memory-test.c++"
                 ,0x3c,ERROR,"\"failed: expected \" \"!(destroyed1 || destroyed2)\"",
                 (char (*) [45])"failed: expected !(destroyed1 || destroyed2)");
      local_45 = false;
    }
  }
  pNVar1 = Own<kj::(anonymous_namespace)::Nested>::operator->
                     ((Own<kj::(anonymous_namespace)::Nested> *)local_28);
  other = mv<kj::Own<kj::(anonymous_namespace)::Nested>>(&pNVar1->nested);
  Own<kj::(anonymous_namespace)::Nested>::operator=
            ((Own<kj::(anonymous_namespace)::Nested> *)local_28,other);
  if ((nested.ptr._7_1_ & 1) == 0) {
    local_46 = _::Debug::shouldLog(ERROR);
    while (local_46 != false) {
      _::Debug::log<char_const(&)[28]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/memory-test.c++"
                 ,0x3e,ERROR,"\"failed: expected \" \"destroyed1\"",
                 (char (*) [28])"failed: expected destroyed1");
      local_46 = false;
    }
  }
  if ((nested.ptr._6_1_ & 1) != 0) {
    local_47 = _::Debug::shouldLog(ERROR);
    while (local_47 != false) {
      _::Debug::log<char_const(&)[31]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/memory-test.c++"
                 ,0x3f,ERROR,"\"failed: expected \" \"!(destroyed2)\"",
                 (char (*) [31])"failed: expected !(destroyed2)");
      local_47 = false;
    }
  }
  Own<kj::(anonymous_namespace)::Nested>::operator=
            ((Own<kj::(anonymous_namespace)::Nested> *)local_28,(void *)0x0);
  if (((nested.ptr._7_1_ & 1) == 0) || ((nested.ptr._6_1_ & 1) == 0)) {
    local_48 = _::Debug::shouldLog(ERROR);
    while (local_48 != false) {
      _::Debug::log<char_const(&)[42]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/memory-test.c++"
                 ,0x41,ERROR,"\"failed: expected \" \"destroyed1 && destroyed2\"",
                 (char (*) [42])"failed: expected destroyed1 && destroyed2");
      local_48 = false;
    }
  }
  Own<kj::(anonymous_namespace)::Nested>::~Own((Own<kj::(anonymous_namespace)::Nested> *)local_28);
  return;
}

Assistant:

TEST(Memory, AssignNested) {
  bool destroyed1 = false, destroyed2 = false;
  auto nested = heap<Nested>(destroyed1);
  nested->nested = heap<Nested>(destroyed2);
  EXPECT_FALSE(destroyed1 || destroyed2);
  nested = kj::mv(nested->nested);
  EXPECT_TRUE(destroyed1);
  EXPECT_FALSE(destroyed2);
  nested = nullptr;
  EXPECT_TRUE(destroyed1 && destroyed2);
}